

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

int lws_buflist_aware_read(lws_context_per_thread *pt,lws *wsi,lws_tokens *ebuf,char fr,char *hint)

{
  int iVar1;
  uchar *buf;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  lws_log_cx *cx;
  uint8_t *b;
  uint8_t *ep;
  int bns;
  int e;
  int n;
  char *hint_local;
  char fr_local;
  lws_tokens *ebuf_local;
  lws *wsi_local;
  lws_context_per_thread *pt_local;
  
  if (ebuf->token == (uchar *)0x0) {
    ebuf->token = pt->serv_buf + 0x10;
  }
  if ((ebuf->len == 0) || (((wsi->a).context)->pt_serv_buf_size - 0x10 < (uint)ebuf->len)) {
    ebuf->len = ((wsi->a).context)->pt_serv_buf_size - 0x10;
  }
  iVar1 = ebuf->len;
  buf = ebuf->token;
  hint_local._7_1_ = fr;
  if ((*(ulong *)&wsi->field_0x46e >> 1 & 1) != 0) {
    hint_local._7_1_ = '\x01';
  }
  sVar5 = lws_buflist_next_segment_len(&wsi->buflist,&ebuf->token);
  iVar3 = (int)sVar5;
  puVar2 = ebuf->token;
  if ((hint_local._7_1_ != '\0') || (iVar3 == 0)) {
    ebuf->token = buf;
    iVar4 = lws_ssl_capable_read(wsi,buf,(long)iVar1);
    ebuf->len = iVar4;
    cx = lwsl_wsi_get_cx(wsi);
    _lws_log_cx(cx,lws_log_prepend_wsi,wsi,0x10,"lws_buflist_aware_read","%s: ssl_capable_read %d",
                hint,ebuf->len);
    if ((iVar3 == 0) && (iVar4 == -1)) {
      _lws_log(0x10,"%s: SSL_CAPABLE_ERROR\n","lws_buflist_aware_read");
      return -1;
    }
    if ((0 < iVar4) || (iVar3 == 0)) {
      if ((hint_local._7_1_ == '\0') || (iVar3 == 0)) {
        return 0;
      }
      iVar4 = lws_buflist_append_segment(&wsi->buflist,ebuf->token,(long)ebuf->len);
      if (iVar4 < 0) {
        return -1;
      }
      if ((iVar4 != 0) && (iVar4 = lws_dll2_is_detached(&wsi->dll_buflist), iVar4 != 0)) {
        lws_dll2_add_head(&wsi->dll_buflist,&pt->dll_buflist_owner);
      }
    }
  }
  ebuf->token = puVar2;
  if (iVar1 < iVar3) {
    ebuf->len = iVar1;
  }
  else {
    ebuf->len = iVar3;
  }
  return 1;
}

Assistant:

int
lws_buflist_aware_read(struct lws_context_per_thread *pt, struct lws *wsi,
		       struct lws_tokens *ebuf, char fr, const char *hint)
{
	int n, e, bns;
	uint8_t *ep, *b;

	// lwsl_debug("%s: %s: %s: prior %d\n", __func__, lws_wsi_tag(wsi), hint, prior);
	// lws_buflist_describe(&wsi->buflist, wsi, __func__);

	(void)hint;
	if (!ebuf->token)
		ebuf->token = pt->serv_buf + LWS_PRE;
	if (!ebuf->len ||
	    (unsigned int)ebuf->len > wsi->a.context->pt_serv_buf_size - LWS_PRE)
		ebuf->len = (int)(wsi->a.context->pt_serv_buf_size - LWS_PRE);

	e = ebuf->len;
	ep = ebuf->token;

	/* h2 or muxed stream... must force the read due to HOL blocking */

	if (wsi->mux_substream)
		fr = 1;

	/* there's something on the buflist? */

	bns = (int)lws_buflist_next_segment_len(&wsi->buflist, &ebuf->token);
	b = ebuf->token;

	if (!fr && bns)
		goto buflist_material;

	/* we're going to read something */

	ebuf->token = ep;
	ebuf->len = n = lws_ssl_capable_read(wsi, ep, (size_t)e);

	lwsl_wsi_debug(wsi, "%s: ssl_capable_read %d", hint, ebuf->len);

	if (!bns && /* only acknowledge error when we handled buflist content */
	    n == LWS_SSL_CAPABLE_ERROR) {
		lwsl_debug("%s: SSL_CAPABLE_ERROR\n", __func__);
		return -1;
	}

	if (n <= 0 && bns)
		/*
		 * There wasn't anything to read yet, but there's something
		 * on the buflist to give him
		 */
		goto buflist_material;

	/* we read something */

	if (fr && bns) {
		/*
		 * Stash what we read, since there's earlier buflist material
		 */

		n = lws_buflist_append_segment(&wsi->buflist, ebuf->token, (size_t)ebuf->len);
		if (n < 0)
			return -1;
		if (n && lws_dll2_is_detached(&wsi->dll_buflist))
			lws_dll2_add_head(&wsi->dll_buflist,
					  &pt->dll_buflist_owner);

		goto buflist_material;
	}

	/*
	 * directly return what we read
	 */

	return 0;

buflist_material:

	ebuf->token = b;
	if (e < bns)
		/* restrict to e, if more than e available */
		ebuf->len = e;
	else
		ebuf->len = bns;

	return 1; /* from buflist */
}